

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O1

void __thiscall directory::shrink(directory *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined8 in_RCX;
  ulong uVar3;
  ulong __nbytes;
  int iVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  ulong uVar5;
  bool bVar6;
  bucket bucket;
  fstream bucketFile;
  bucket local_270;
  string *local_248;
  undefined1 local_240 [528];
  
  bVar6 = this->bucket_size != 0;
  uVar3 = CONCAT71((int7)((ulong)in_RCX >> 8),bVar6);
  if (bVar6) {
    local_248 = &this->typeName;
    uVar5 = 0;
    do {
      __nbytes = uVar3;
      generateBucketFileName
                ((string *)&local_270,local_248,
                 (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar5]);
      std::fstream::fstream(local_240,(string *)&local_270,_S_out|_S_in|_S_bin);
      __buf = extraout_RDX;
      if ((vector<index,_std::allocator<index>_> *)CONCAT44(local_270._4_4_,local_270.id) !=
          &local_270.indices) {
        operator_delete((undefined1 *)CONCAT44(local_270._4_4_,local_270.id),
                        (ulong)((long)&(local_270.indices.
                                        super__Vector_base<index,_std::allocator<index>_>._M_impl.
                                        super__Vector_impl_data._M_start)->file_id + 1));
        __buf = extraout_RDX_00;
      }
      local_270._4_4_ = local_270._4_4_ & 0xffffff00;
      local_270.depth = 1;
      local_270.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_270.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_270.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::bucket::read(&local_270,(int)local_240,__buf,__nbytes);
      uVar1 = ::bucket::getDepth(&local_270);
      uVar2 = this->depth;
      if (local_270.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_270.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_270.indices.super__Vector_base<index,_std::allocator<index>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_270.indices.super__Vector_base<index,_std::allocator<index>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::fstream::~fstream(local_240);
      if (uVar1 == uVar2) {
        if ((uVar3 & 1) != 0) {
          return;
        }
        break;
      }
      uVar5 = uVar5 + 1;
      bVar6 = uVar5 < this->bucket_size;
      uVar3 = CONCAT71((int7)(__nbytes >> 8),bVar6);
    } while (bVar6);
  }
  uVar2 = this->depth - 1;
  this->depth = uVar2;
  if (uVar2 != 0x1f) {
    iVar4 = 1 << ((byte)uVar2 & 0x1f);
    if (iVar4 < 2) {
      iVar4 = 1;
    }
    (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + (-1 - (ulong)(iVar4 - 1));
  }
  this->bucket_size = this->bucket_size >> 1;
  return;
}

Assistant:

void directory::shrink() {
    for (int i = 0; i < bucket_size; ++i) {
        fstream bucketFile(generateBucketFileName(typeName, bucket_ids[i]), INOUTBIN);

        bucket bucket;

        bucket.read(bucketFile);

        if(bucket.getDepth() == depth) {
            return;
        }
    }

    depth--;

    for (int j = 0; j < 1 << depth; ++j) {
        bucket_ids.pop_back();
    }

    bucket_size = bucket_size >> 1;
}